

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O2

void Bdc_SuppMinimize(Bdc_Man_t *p,Bdc_Isf_t *pIsf)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  int iVar;
  
  iVar = 0;
  if (p->pPars->fVerbose == 0) {
    aVar2 = 0;
  }
  else {
    aVar2 = Abc_Clock();
  }
  pIsf->uSupp = 0;
  do {
    if (p->nVars <= iVar) {
      if (p->pPars->fVerbose != 0) {
        aVar3 = Abc_Clock();
        p->timeSupps = p->timeSupps + (aVar3 - aVar2);
      }
      return;
    }
    iVar1 = Kit_TruthVarInSupport(pIsf->puOn,p->nVars,iVar);
    if (iVar1 == 0) {
      iVar1 = Kit_TruthVarInSupport(pIsf->puOff,p->nVars,iVar);
      if (iVar1 != 0) goto LAB_004bdfb7;
    }
    else {
LAB_004bdfb7:
      iVar1 = Kit_TruthVarIsVacuous(pIsf->puOn,pIsf->puOff,p->nVars,iVar);
      if (iVar1 == 0) {
        pIsf->uSupp = pIsf->uSupp | 1 << ((byte)iVar & 0x1f);
      }
      else {
        Kit_TruthExist(pIsf->puOn,p->nVars,iVar);
        Kit_TruthExist(pIsf->puOff,p->nVars,iVar);
      }
    }
    iVar = iVar + 1;
  } while( true );
}

Assistant:

void Bdc_SuppMinimize( Bdc_Man_t * p, Bdc_Isf_t * pIsf )
{
    int v;
    abctime clk = 0; // Suppress "might be used uninitialized"
    if ( p->pPars->fVerbose )
        clk = Abc_Clock();
    // go through the support variables
    pIsf->uSupp = 0;
    for ( v = 0; v < p->nVars; v++ )
    {
        if ( !Kit_TruthVarInSupport( pIsf->puOn, p->nVars, v ) && 
             !Kit_TruthVarInSupport( pIsf->puOff, p->nVars, v ) )
              continue;
        if ( Kit_TruthVarIsVacuous( pIsf->puOn, pIsf->puOff, p->nVars, v ) )
        {
            Kit_TruthExist( pIsf->puOn, p->nVars, v );
            Kit_TruthExist( pIsf->puOff, p->nVars, v );
            continue;
        }
        pIsf->uSupp |= (1 << v);
    }
    if ( p->pPars->fVerbose )
        p->timeSupps += Abc_Clock() - clk;
}